

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O2

void __thiscall
glslang::TParseVersions::float16Check(TParseVersions *this,TSourceLoc *loc,char *op,bool builtIn)

{
  undefined7 in_register_00000009;
  char *extensions [3];
  
  if ((int)CONCAT71(in_register_00000009,builtIn) == 0) {
    extensions[2] = "GL_EXT_shader_explicit_arithmetic_types_float16";
    extensions[0]._0_4_ = 0x724adf;
    extensions[0]._4_4_ = 0;
    extensions[1]._0_4_ = 0x725405;
    extensions[1]._4_4_ = 0;
    (*this->_vptr_TParseVersions[5])(this,loc,3,extensions,op);
  }
  return;
}

Assistant:

void TParseVersions::float16Check(const TSourceLoc& loc, const char* op, bool builtIn)
{
    if (!builtIn) {
        const char* const extensions[] = {
                                           E_GL_AMD_gpu_shader_half_float,
                                           E_GL_EXT_shader_explicit_arithmetic_types,
                                           E_GL_EXT_shader_explicit_arithmetic_types_float16};
        requireExtensions(loc, sizeof(extensions)/sizeof(extensions[0]), extensions, op);
    }
}